

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O0

void ra_append_copy_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index,
               _Bool copy_on_write)

{
  int iVar1;
  container_t *pcVar2;
  int in_ECX;
  int in_EDX;
  uint8_t *in_RSI;
  int *in_RDI;
  undefined1 in_R8B;
  int32_t pos;
  int32_t i;
  int local_20;
  undefined3 in_stack_ffffffffffffffe4;
  uint k;
  int iVar3;
  
  k = CONCAT13(in_R8B,in_stack_ffffffffffffffe4) & 0x1ffffff;
  local_20 = in_EDX;
  extend_array((roaring_array_t *)CONCAT44(in_EDX,in_ECX),k);
  iVar3 = local_20;
  for (; local_20 < in_ECX; local_20 = local_20 + 1) {
    iVar1 = *in_RDI;
    *(undefined2 *)(*(long *)(in_RDI + 4) + (long)iVar1 * 2) =
         *(undefined2 *)(*(long *)(in_RSI + 0x10) + (long)local_20 * 2);
    if ((k & 0x1000000) == 0) {
      pcVar2 = container_clone((container_t *)CONCAT44(iVar3,in_ECX),(uint8_t)(k >> 0x18));
      *(container_t **)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) = pcVar2;
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar1) =
           *(undefined1 *)(*(long *)(in_RSI + 0x18) + (long)local_20);
    }
    else {
      pcVar2 = get_copy_of_container(in_RDI,in_RSI,SUB41((uint)iVar3 >> 0x18,0));
      *(container_t **)(*(long *)(in_RSI + 8) + (long)local_20 * 8) = pcVar2;
      *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) =
           *(undefined8 *)(*(long *)(in_RSI + 8) + (long)local_20 * 8);
      *(undefined1 *)(*(long *)(in_RDI + 6) + (long)iVar1) =
           *(undefined1 *)(*(long *)(in_RSI + 0x18) + (long)local_20);
    }
    *in_RDI = *in_RDI + 1;
  }
  return;
}

Assistant:

void ra_append_copy_range(roaring_array_t *ra, const roaring_array_t *sa,
                          int32_t start_index, int32_t end_index,
                          bool copy_on_write) {
    extend_array(ra, end_index - start_index);
    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;
        ra->keys[pos] = sa->keys[i];
        if (copy_on_write) {
            sa->containers[i] = get_copy_of_container(
                sa->containers[i], &sa->typecodes[i], copy_on_write);
            ra->containers[pos] = sa->containers[i];
            ra->typecodes[pos] = sa->typecodes[i];
        } else {
            ra->containers[pos] =
                container_clone(sa->containers[i], sa->typecodes[i]);
            ra->typecodes[pos] = sa->typecodes[i];
        }
        ra->size++;
    }
}